

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O1

void ravi_print_function(membuff_t *mb,Proto *f,int full)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Instruction *pIVar4;
  TString *pTVar5;
  LocVar *pLVar6;
  Upvaldesc *pUVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  Proto *pPVar15;
  TString *pTVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar17;
  undefined8 extraout_RDX_01;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  ulong uVar23;
  byte bVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  char *pcVar28;
  
  pTVar16 = (TString *)"=?";
  if (f->source != (TString *)0x0) {
    pTVar16 = f->source + 1;
  }
  cVar1 = *(char *)&pTVar16->next;
  if (cVar1 == '\x1b') {
    pcVar12 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar12 = (char *)((long)&pTVar16->next + 1);
  }
  else {
    pcVar12 = "(string)";
  }
  uVar2 = f->sizep;
  pcVar13 = "function";
  if (f->linedefined == 0) {
    pcVar13 = "main";
  }
  pcVar18 = "s";
  pcVar22 = "s";
  if (f->sizecode == 1) {
    pcVar22 = "";
  }
  membuff_add_fstring(mb,"\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar13,pcVar12,
                      (ulong)(uint)f->linedefined,(ulong)(uint)f->lastlinedefined,
                      (ulong)(uint)f->sizecode,pcVar22,f);
  pcVar12 = "-+";
  if (f->is_vararg == '\0') {
    pcVar12 = "\x01";
  }
  pcVar13 = "s";
  if (f->numparams == 1) {
    pcVar13 = "";
  }
  pcVar22 = "s";
  if (f->maxstacksize == 1) {
    pcVar22 = "";
  }
  pcVar28 = "s";
  if (f->sizeupvalues == 1) {
    pcVar28 = "";
  }
  membuff_add_fstring(mb,"%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)f->numparams,pcVar12 + 1,
                      pcVar13,(ulong)f->maxstacksize,pcVar22,(ulong)(uint)f->sizeupvalues,pcVar28);
  pcVar12 = "s";
  if (f->sizelocvars == 1) {
    pcVar12 = "";
  }
  pcVar13 = "s";
  if (f->sizek == 1) {
    pcVar13 = "";
  }
  if (f->sizep == 1) {
    pcVar18 = "";
  }
  membuff_add_fstring(mb,"%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)f->sizelocvars,
                      pcVar12,(ulong)(uint)f->sizek,pcVar13,(ulong)(uint)f->sizep,pcVar18);
  iVar3 = f->sizecode;
  if (0 < iVar3) {
    pIVar4 = f->code;
    uVar27 = 0;
    do {
      if (f->lineinfo == (int *)0x0) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = f->lineinfo[(int)uVar27];
      }
      uVar21 = pIVar4[(int)uVar27];
      uVar26 = uVar27 + 1;
      membuff_add_fstring(mb,"\t%d\t",(ulong)uVar26);
      if ((int)uVar10 < 1) {
        membuff_add_fstring(mb,"[-]\t");
      }
      else {
        membuff_add_fstring(mb,"[%d]\t",(ulong)uVar10);
      }
      uVar20 = uVar21 >> 8;
      uVar19 = (ulong)(uVar20 & 0x7f);
      uVar9 = uVar21 >> 0x18;
      uVar23 = (ulong)uVar9;
      uVar10 = uVar21 >> 0x10;
      uVar11 = uVar10 & 0xff;
      membuff_add_fstring(mb,"%-9s\t",luaP_opnames[uVar21 & 0xff]);
      bVar24 = luaP_opmodes[uVar21 & 0xff];
      switch(bVar24 & 3) {
      case 0:
        membuff_add_fstring(mb,"%d",uVar19);
        if ((bVar24 >> 4 & 3) != 0) {
          uVar14 = uVar23;
          if (((bVar24 >> 4 & 3) == 3) && ((int)uVar21 < 0)) {
            uVar14 = (ulong)(~uVar9 | 0xffffff80);
          }
          membuff_add_fstring(mb," %d",uVar14);
        }
        bVar24 = bVar24 >> 2 & 3;
        if (bVar24 != 0) {
          uVar14 = (ulong)uVar11;
          if ((bVar24 == 3) && (uVar14 = (ulong)uVar11, (uVar21 >> 0x17 & 1) != 0)) {
            uVar14 = (ulong)(~uVar10 | 0xffffff80);
          }
LAB_0011e497:
          pcVar12 = " %d";
          goto LAB_0011e4b6;
        }
        break;
      case 1:
        membuff_add_fstring(mb,"%d",uVar19);
        if ((bVar24 & 0x30) == 0x10) {
          pcVar12 = " %d";
          uVar14 = (ulong)uVar10;
          goto LAB_0011e4b6;
        }
        if ((bVar24 & 0x30) == 0x30) {
          uVar14 = (ulong)~uVar10;
          goto LAB_0011e497;
        }
        break;
      case 2:
        membuff_add_fstring(mb,"%d %d",uVar19,(ulong)(uVar10 - 0x8000));
        break;
      case 3:
        pcVar12 = "%d";
        uVar14 = (ulong)~uVar20;
LAB_0011e4b6:
        membuff_add_fstring(mb,pcVar12,uVar14);
      }
      switch(uVar21 & 0xff) {
      case 1:
        membuff_add_fstring(mb,"\t; ");
        goto LAB_0011e622;
      default:
switchD_0011e4da_caseD_2:
        break;
      case 5:
      case 9:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
        pTVar16 = f->upvalues[uVar23].name;
        pPVar15 = (Proto *)(pTVar16 + 1);
        if (pTVar16 == (TString *)0x0) {
          pPVar15 = (Proto *)0x158e9e;
        }
        pcVar12 = "\t; %s";
        goto LAB_0011e5ee;
      case 6:
      case 0x73:
        pTVar5 = f->upvalues[uVar23].name;
        pTVar16 = pTVar5 + 1;
        if (pTVar5 == (TString *)0x0) {
          pTVar16 = (TString *)0x158e9e;
        }
        membuff_add_fstring(mb,"\t; %s",pTVar16);
        if ((uVar21 >> 0x17 & 1) != 0) {
          membuff_add_string(mb," ");
          PrintConstant(mb,f,uVar10 & 0x7f);
        }
        break;
      case 7:
      case 0xc:
      case 0x50:
      case 0x51:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x71:
        if ((uVar21 >> 0x17 & 1) == 0) goto switchD_0011e4da_caseD_2;
        membuff_add_fstring(mb,"\t; ");
LAB_0011e610:
        uVar10 = uVar10 & 0x7f;
        goto LAB_0011e622;
      case 8:
        pTVar5 = f->upvalues[uVar19].name;
        pTVar16 = pTVar5 + 1;
        if (pTVar5 == (TString *)0x0) {
          pTVar16 = (TString *)0x158e9e;
        }
        membuff_add_fstring(mb,"\t; %s",pTVar16);
        if ((int)uVar21 < 0) {
          membuff_add_string(mb," ");
          PrintConstant(mb,f,uVar9 & 0x7f);
        }
        if ((uVar21 >> 0x17 & 1) != 0) {
          membuff_add_string(mb," ");
          goto LAB_0011e610;
        }
        break;
      case 10:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x62:
      case 99:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6c:
      case 0x6f:
      case 0x72:
        if ((uVar21 & 0x80800000) == 0) goto switchD_0011e4da_caseD_2;
        membuff_add_fstring(mb,"\t; ");
        if ((int)uVar21 < 0) {
          PrintConstant(mb,f,uVar9 & 0x7f);
        }
        else {
          membuff_add_fstring(mb,"-");
        }
        membuff_add_string(mb," ");
        if ((uVar21 >> 0x17 & 1) == 0) {
          membuff_add_fstring(mb,"-");
        }
        else {
          PrintConstant(mb,f,uVar10 & 0x7f);
        }
        break;
      case 0x1e:
      case 0x27:
      case 0x28:
      case 0x2a:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
        membuff_add_fstring(mb,"\t; to %d",(ulong)(uVar27 + 2 + (uVar10 - 0x8000)));
        break;
      case 0x2b:
        if (uVar11 == 0) {
          membuff_add_fstring(mb,"\t; %d",(ulong)pIVar4[(int)uVar26]);
          uVar27 = uVar26;
        }
        else {
          membuff_add_fstring(mb,"\t; %d");
        }
        break;
      case 0x2c:
        pPVar15 = f->p[uVar10];
        pcVar12 = "\t; %p";
LAB_0011e5ee:
        membuff_add_fstring(mb,pcVar12,pPVar15);
        break;
      case 0x2e:
        membuff_add_fstring(mb,"\t; ");
        uVar10 = uVar20;
LAB_0011e622:
        PrintConstant(mb,f,uVar10);
      }
      membuff_add_fstring(mb,"\n");
      uVar27 = uVar27 + 1;
    } while ((int)uVar27 < iVar3);
  }
  uVar27 = f->sizek;
  membuff_add_fstring(mb,"constants (%d) for %p:\n",(ulong)uVar27,f);
  if (0 < (int)uVar27) {
    uVar10 = 0;
    do {
      uVar21 = uVar10 + 1;
      membuff_add_fstring(mb,"\t%d\t",(ulong)uVar21);
      PrintConstant(mb,f,uVar10);
      membuff_add_fstring(mb,"\n");
      uVar10 = uVar21;
    } while (uVar27 != uVar21);
  }
  uVar27 = f->sizelocvars;
  membuff_add_fstring(mb,"locals (%d) for %p:\n",(ulong)uVar27,f);
  if (0 < (long)(int)uVar27) {
    lVar25 = 0x14;
    uVar23 = 0;
    do {
      pLVar6 = f->locvars;
      membuff_add_fstring(mb,"\t%d\t%s\t%d\t%d\n",uVar23 & 0xffffffff,
                          *(long *)((long)pLVar6 + lVar25 + -0x14) + 0x18,
                          (ulong)(*(int *)((long)pLVar6 + lVar25 + -4) + 1),
                          (ulong)(*(int *)((long)&pLVar6->varname + lVar25) + 1));
      uVar23 = uVar23 + 1;
      lVar25 = lVar25 + 0x20;
    } while ((long)(int)uVar27 != uVar23);
  }
  uVar27 = f->sizeupvalues;
  membuff_add_fstring(mb,"upvalues (%d) for %p:\n",(ulong)uVar27,f);
  uVar17 = extraout_RDX;
  if (0 < (long)(int)uVar27) {
    lVar25 = 0x15;
    uVar23 = 0;
    do {
      pUVar7 = f->upvalues;
      lVar8 = *(long *)((long)pUVar7 + lVar25 + -0x15);
      pcVar12 = (char *)(lVar8 + 0x18);
      if (lVar8 == 0) {
        pcVar12 = "-";
      }
      membuff_add_fstring(mb,"\t%d\t%s\t%d\t%d\n",uVar23 & 0xffffffff,pcVar12,
                          (ulong)*(byte *)((long)pUVar7 + lVar25 + -1),
                          (ulong)*(byte *)((long)&pUVar7->name + lVar25));
      uVar23 = uVar23 + 1;
      lVar25 = lVar25 + 0x18;
      uVar17 = extraout_RDX_00;
    } while ((long)(int)uVar27 != uVar23);
  }
  if (0 < (int)uVar2) {
    uVar23 = 0;
    do {
      ravi_print_function(mb,f->p[uVar23],(int)uVar17);
      uVar23 = uVar23 + 1;
      uVar17 = extraout_RDX_01;
    } while (uVar2 != uVar23);
  }
  return;
}

Assistant:

static void ravi_print_function(membuff_t *mb, const Proto* f, int full)
{
  int i, n = f->sizep;
  PrintHeader(mb, f);
  PrintCode(mb, f);
  if (full) PrintDebug(mb, f);
  for (i = 0; i<n; i++) ravi_print_function(mb, f->p[i], full);
}